

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O3

int __thiscall amrex::AmrMesh::GetLevel(AmrMesh *this,Box *domain)

{
  int *piVar1;
  pointer pGVar2;
  undefined8 uVar3;
  bool bVar4;
  int i;
  long lVar5;
  long lVar6;
  pointer pGVar7;
  long lVar8;
  Box ccdomain;
  Box BStack_58;
  
  BStack_58.smallend.vect._0_8_ = *(undefined8 *)(domain->smallend).vect;
  uVar3 = *(undefined8 *)((domain->smallend).vect + 2);
  BStack_58.bigend.vect[1] = (int)((ulong)*(undefined8 *)(domain->bigend).vect >> 0x20);
  BStack_58._20_8_ = *(ulong *)((domain->bigend).vect + 2);
  BStack_58.smallend.vect[2] = (int)uVar3;
  BStack_58.bigend.vect[0] = (int)((ulong)uVar3 >> 0x20);
  lVar5 = 0;
  do {
    if ((BStack_58.btype.itype >> ((uint)lVar5 & 0x1f) & 1) != 0) {
      piVar1 = BStack_58.bigend.vect + lVar5;
      *piVar1 = *piVar1 + -1;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 3);
  BStack_58._20_8_ = BStack_58._20_8_ & 0xffffffff;
  pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar2 != pGVar7 && -1 < (long)pGVar2 - (long)pGVar7) {
    lVar5 = 0xac;
    lVar8 = 0;
    do {
      bVar4 = Box::operator==((Box *)((long)(pGVar7->super_CoordSys).offset + lVar5 + -8),&BStack_58
                             );
      if (bVar4) {
        return (int)lVar8;
      }
      lVar8 = lVar8 + 1;
      pGVar7 = (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = ((long)(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pGVar7 >> 3) * -0x70a3d70a3d70a3d7;
      lVar5 = lVar5 + 200;
    } while (lVar6 - lVar8 != 0 && lVar8 <= lVar6);
  }
  return -1;
}

Assistant:

int
AmrMesh::GetLevel (Box const& domain) noexcept
{
    Box ccdomain = amrex::enclosedCells(domain);
    for (int lev = 0; lev < geom.size(); ++lev) {
        if (geom[lev].Domain() == ccdomain) return lev;
    }
    return -1;
}